

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::elemsStr<float_const*>
          (string *__return_storage_ptr__,Functional *this,float **begin,float **end,
          int wrapLengthParam,int numIndentationSpaces)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 *puVar4;
  string *extraout_RAX;
  string *psVar5;
  size_type *psVar6;
  ulong *puVar7;
  float *pfVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  string deepIndentation;
  string baseIndentation;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  int local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  float **local_200;
  Functional *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [32];
  ulong local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d0._0_8_ = local_1d0 + 0x10;
  local_200 = begin;
  local_1f8 = this;
  std::__cxx11::string::_M_construct((ulong)local_1d0,'\0');
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)local_1a8 + 0x10);
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,'\x04');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,local_1d0._0_8_);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1f0.field_2._M_allocated_capacity = *psVar6;
    local_1f0.field_2._8_8_ = plVar3[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar6;
    local_1f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_24c = 0x7fffffff;
  if (0 < (int)end) {
    local_24c = (int)end;
  }
  uVar12 = (ulong)((long)*local_200 - *(long *)local_1f8) >> 2;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar11 = (int)uVar12;
  if (local_24c < iVar11) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x9525ef);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_218 = *puVar7;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar7;
      local_228 = (ulong *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_260 = *puVar7;
      lStack_258 = plVar3[3];
      local_270 = &local_260;
    }
    else {
      local_260 = *puVar7;
      local_270 = (ulong *)*plVar3;
    }
    local_268 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_270);
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  local_228 = &local_218;
  local_220 = 0;
  local_218 = local_218 & 0xffffffffffffff00;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_260 = *puVar7;
    lStack_258 = plVar3[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar7;
    local_270 = (ulong *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_24c < iVar11) {
    std::operator+(&local_248,"\n",&local_1f0);
  }
  else {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248," ","");
  }
  uVar9 = 0xf;
  if (local_270 != &local_260) {
    uVar9 = local_260;
  }
  if (uVar9 < local_248._M_string_length + local_268) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar10 = local_248.field_2._M_allocated_capacity;
    }
    if (local_248._M_string_length + local_268 <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_270);
      goto LAB_003c5789;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_248._M_dataplus._M_p);
LAB_003c5789:
  psVar6 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1a8[0].field_2._0_8_ = *psVar6;
    local_1a8[0].field_2._8_8_ = puVar4[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar6;
    local_1a8[0]._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_1a8[0]._M_string_length = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)psVar6 = 0;
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_248.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_1b0 = uVar12;
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_208 = paVar1;
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  pfVar8 = *(float **)local_1f8;
  if (pfVar8 != *local_200) {
    iVar11 = 0;
    do {
      if (pfVar8 != *(float **)local_1f8) {
        local_228 = &local_218;
        local_220 = 0;
        local_218 = local_218 & 0xffffffffffffff00;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
        puVar7 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar7) {
          local_260 = *puVar7;
          lStack_258 = plVar3[3];
          local_270 = &local_260;
        }
        else {
          local_260 = *puVar7;
          local_270 = (ulong *)*plVar3;
        }
        local_268 = plVar3[1];
        *plVar3 = (long)puVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (iVar11 % local_24c == 0) {
          std::operator+(&local_248,"\n",&local_1f0);
        }
        else {
          local_248._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,0x96985f);
        }
        uVar12 = 0xf;
        if (local_270 != &local_260) {
          uVar12 = local_260;
        }
        if (uVar12 < local_248._M_string_length + local_268) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar2) {
            uVar10 = local_248.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_248._M_string_length + local_268) goto LAB_003c598f;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_003c598f:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_248._M_dataplus._M_p);
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)((long)local_1a8 + 0x10);
        psVar6 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_1a8[0].field_2._0_8_ = *psVar6;
          local_1a8[0].field_2._8_8_ = puVar4[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar6;
          local_1a8[0]._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_1a8[0]._M_string_length = puVar4[1];
        *puVar4 = psVar6;
        puVar4[1] = 0;
        *(undefined1 *)psVar6 = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_1a8 + 0x10U)) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<double>((double)*pfVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_270);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      iVar11 = iVar11 + 1;
      pfVar8 = pfVar8 + 1;
    } while (pfVar8 != *local_200);
  }
  if (local_24c < (int)local_1b0) {
    std::operator+(local_1a8,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  }
  else {
    local_1a8[0]._M_dataplus._M_p = (pointer)((long)local_1a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," ","");
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)local_1a8 + 0x10U)) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  psVar5 = (string *)(local_1d0 + 0x10);
  if ((string *)local_1d0._0_8_ != psVar5) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

static string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const string	baseIndentation	= string(numIndentationSpaces, ' ');
	const string	deepIndentation	= baseIndentation + string(4, ' ');
	const int		wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : std::numeric_limits<int>::max();
	const int		length			= (int)std::distance(begin, end);
	string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}